

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void luaX_init(lua_State *L)

{
  char *str;
  size_t l;
  TString *pTVar1;
  TString *ts;
  int i;
  lua_State *L_local;
  
  for (ts._4_4_ = 0; ts._4_4_ < 0x15; ts._4_4_ = ts._4_4_ + 1) {
    str = luaX_tokens[ts._4_4_];
    l = strlen(luaX_tokens[ts._4_4_]);
    pTVar1 = luaS_newlstr(L,str,l);
    (pTVar1->tsv).marked = (pTVar1->tsv).marked | 0x20;
    (pTVar1->tsv).reserved = (char)ts._4_4_ + '\x01';
  }
  return;
}

Assistant:

void luaX_init (lua_State *L) {
  int i;
  for (i=0; i<NUM_RESERVED; i++) {
    TString *ts = luaS_new(L, luaX_tokens[i]);
    luaS_fix(ts);  /* reserved words are never collected */
    lua_assert(strlen(luaX_tokens[i])+1 <= TOKEN_LEN);
    ts->tsv.reserved = cast_byte(i+1);  /* reserved word */
  }
}